

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
MatchExpr<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>,_EqualsRange<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>_>_>
::streamReconstructedExpression
          (MatchExpr<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>,_EqualsRange<std::map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_>_>_>
           *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  map<Point,_double,_PointCmp,_std::allocator<std::pair<const_Point,_double>_>_> *value;
  string matcherAsString;
  char local_59;
  string local_58;
  type local_38;
  
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
            (&local_58,(MatcherUntypedBase *)&this->m_matcher);
  StringMaker<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>,void>::
  convert<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>>
            (&local_38,
             (StringMaker<std::map<Point,double,PointCmp,std::allocator<std::pair<Point_const,double>>>,void>
              *)this->m_arg,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_59 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_58._M_string_length == DAT_002976a0) {
    if (local_58._M_string_length != 0) {
      iVar1 = bcmp(local_58._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                   local_58._M_string_length);
      if (iVar1 != 0) goto LAB_00171438;
    }
    Catch::operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
LAB_00171438:
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }